

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

size_t __thiscall
kj::ArrayInputStream::tryRead(ArrayInputStream *this,ArrayPtr<unsigned_char> dst,size_t minBytes)

{
  uchar *__dest;
  uchar *__src;
  ArrayPtr<const_unsigned_char> AVar1;
  uchar *local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> local_30;
  size_t n;
  size_t minBytes_local;
  ArrayInputStream *this_local;
  ArrayPtr<unsigned_char> dst_local;
  
  dst_local.ptr = (uchar *)dst.size_;
  this_local = (ArrayInputStream *)dst.ptr;
  n = minBytes;
  minBytes_local = (size_t)this;
  local_38 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
  local_40 = ArrayPtr<const_unsigned_char>::size(&this->array);
  local_30 = min<unsigned_long,unsigned_long>(&local_38,&local_40);
  __dest = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
  __src = ArrayPtr<const_unsigned_char>::begin(&this->array);
  memcpy(__dest,__src,local_30);
  AVar1 = ArrayPtr<const_unsigned_char>::slice(&this->array,local_30);
  local_50 = AVar1.ptr;
  (this->array).ptr = local_50;
  local_48 = AVar1.size_;
  (this->array).size_ = local_48;
  return local_30;
}

Assistant:

size_t ArrayInputStream::tryRead(ArrayPtr<byte> dst, size_t minBytes) {
  size_t n = kj::min(dst.size(), array.size());
  memcpy(dst.begin(), array.begin(), n);
  array = array.slice(n);
  return n;
}